

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O2

void compute_color_line_STDEV(uchar *uncompressed,int channels,float *point,float *direction)

{
  byte bVar1;
  uint3 uVar2;
  uint uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  byte bVar15;
  float fVar14;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  
  fVar5 = 0.0;
  fVar8 = 0.0;
  fVar13 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  fVar11 = 0.0;
  fVar12 = 0.0;
  for (lVar4 = 0; lVar4 < channels << 4; lVar4 = lVar4 + channels) {
    bVar1 = uncompressed[lVar4 + 2];
    bVar15 = (byte)((ushort)*(undefined2 *)(uncompressed + lVar4) >> 8);
    uVar2 = CONCAT12(bVar15,*(undefined2 *)(uncompressed + lVar4));
    uVar3 = (uint)uVar2;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (ulong)(CONCAT14(bVar15,uVar3) & 0xffffff00ff) & 0xffffffff0000ffff;
    uVar16 = (uint)bVar15;
    fVar9 = fVar9 + (float)(uVar3 & 0xff);
    fVar10 = fVar10 + (float)uVar16;
    fVar5 = fVar5 + (float)bVar1;
    fVar13 = fVar13 + (float)((uint)bVar1 * (uint)bVar1);
    fVar8 = fVar8 + (float)(uVar16 * uVar16);
    auVar17._0_8_ = (ulong)CONCAT34(uVar2,uVar3) & 0xff000000ff;
    auVar17[8] = bVar15;
    auVar17._9_3_ = 0;
    auVar17[0xc] = bVar15;
    auVar17._13_3_ = 0;
    auVar17 = pmaddwd(auVar17,auVar18);
    fVar11 = fVar11 + (float)auVar17._0_4_;
    fVar12 = fVar12 + (float)auVar17._4_4_;
    auVar18 = pmaddwd(ZEXT516(CONCAT14(bVar1,(uint)bVar1)),auVar18);
    fVar6 = fVar6 + (float)auVar18._0_4_;
    fVar7 = fVar7 + (float)auVar18._4_4_;
  }
  fVar9 = fVar9 * 0.0625;
  fVar10 = fVar10 * 0.0625;
  fVar5 = fVar5 * 0.0625;
  fVar13 = fVar5 * -16.0 * fVar5 + fVar13;
  *(ulong *)point = CONCAT44(fVar10,fVar9);
  point[2] = fVar5;
  fVar14 = fVar9 * -16.0;
  fVar8 = fVar10 * fVar10 * -16.0 + fVar8;
  fVar11 = fVar14 * fVar9 + fVar11;
  fVar12 = fVar14 * fVar10 + fVar12;
  fVar6 = fVar5 * fVar14 + fVar6;
  fVar7 = fVar5 * fVar10 * -16.0 + fVar7;
  fVar10 = fVar6 * 3.1415927 + fVar12 * 2.7182817 + fVar11;
  fVar14 = fVar7 * 3.1415927 + fVar8 * 2.7182817 + fVar12;
  fVar5 = fVar13 * 3.1415927 + fVar7 * 2.7182817 + fVar6;
  fVar9 = fVar5 * fVar6 + fVar10 * fVar11 + fVar12 * fVar14;
  fVar19 = fVar5 * fVar7 + fVar8 * fVar14 + fVar10 * fVar12;
  fVar5 = fVar5 * fVar13 + fVar10 * fVar6 + fVar14 * fVar7;
  *(ulong *)direction =
       CONCAT44(fVar5 * fVar7 + fVar9 * fVar12 + fVar19 * fVar8,
                fVar5 * fVar6 + fVar9 * fVar11 + fVar19 * fVar12);
  direction[2] = fVar5 * fVar13 + fVar9 * fVar6 + fVar7 * fVar19;
  return;
}

Assistant:

void compute_color_line_STDEV(
		const unsigned char *const uncompressed,
		int channels,
		float point[3], float direction[3] )
{
	const float inv_16 = 1.0f / 16.0f;
	int i;
	float sum_r = 0.0f, sum_g = 0.0f, sum_b = 0.0f;
	float sum_rr = 0.0f, sum_gg = 0.0f, sum_bb = 0.0f;
	float sum_rg = 0.0f, sum_rb = 0.0f, sum_gb = 0.0f;
	/*	calculate all data needed for the covariance matrix
		( to compare with _rygdxt code)	*/
	for( i = 0; i < 16*channels; i += channels )
	{
		sum_r += uncompressed[i+0];
		sum_rr += uncompressed[i+0] * uncompressed[i+0];
		sum_g += uncompressed[i+1];
		sum_gg += uncompressed[i+1] * uncompressed[i+1];
		sum_b += uncompressed[i+2];
		sum_bb += uncompressed[i+2] * uncompressed[i+2];
		sum_rg += uncompressed[i+0] * uncompressed[i+1];
		sum_rb += uncompressed[i+0] * uncompressed[i+2];
		sum_gb += uncompressed[i+1] * uncompressed[i+2];
	}
	/*	convert the sums to averages	*/
	sum_r *= inv_16;
	sum_g *= inv_16;
	sum_b *= inv_16;
	/*	and convert the squares to the squares of the value - avg_value	*/
	sum_rr -= 16.0f * sum_r * sum_r;
	sum_gg -= 16.0f * sum_g * sum_g;
	sum_bb -= 16.0f * sum_b * sum_b;
	sum_rg -= 16.0f * sum_r * sum_g;
	sum_rb -= 16.0f * sum_r * sum_b;
	sum_gb -= 16.0f * sum_g * sum_b;
	/*	the point on the color line is the average	*/
	point[0] = sum_r;
	point[1] = sum_g;
	point[2] = sum_b;
	#if USE_COV_MAT
	/*
		The following idea was from ryg.
		(https://mollyrocket.com/forums/viewtopic.php?t=392)
		The method worked great (less RMSE than mine) most of
		the time, but had some issues handling some simple
		boundary cases, like full green next to full red,
		which would generate a covariance matrix like this:

		| 1  -1  0 |
		| -1  1  0 |
		| 0   0  0 |

		For a given starting vector, the power method can
		generate all zeros!  So no starting with {1,1,1}
		as I was doing!  This kind of error is still a
		slight posibillity, but will be very rare.
	*/
	/*	use the covariance matrix directly
		(1st iteration, don't use all 1.0 values!)	*/
	sum_r = 1.0f;
	sum_g = 2.718281828f;
	sum_b = 3.141592654f;
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	/*	2nd iteration, use results from the 1st guy	*/
	sum_r = direction[0];
	sum_g = direction[1];
	sum_b = direction[2];
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	/*	3rd iteration, use results from the 2nd guy	*/
	sum_r = direction[0];
	sum_g = direction[1];
	sum_b = direction[2];
	direction[0] = sum_r*sum_rr + sum_g*sum_rg + sum_b*sum_rb;
	direction[1] = sum_r*sum_rg + sum_g*sum_gg + sum_b*sum_gb;
	direction[2] = sum_r*sum_rb + sum_g*sum_gb + sum_b*sum_bb;
	#else
	/*	use my standard deviation method
		(very robust, a tiny bit slower and less accurate)	*/
	direction[0] = sqrt( sum_rr );
	direction[1] = sqrt( sum_gg );
	direction[2] = sqrt( sum_bb );
	/*	which has a greater component	*/
	if( sum_gg > sum_rr )
	{
		/*	green has greater component, so base the other signs off of green	*/
		if( sum_rg < 0.0f )
		{
			direction[0] = -direction[0];
		}
		if( sum_gb < 0.0f )
		{
			direction[2] = -direction[2];
		}
	} else
	{
		/*	red has a greater component	*/
		if( sum_rg < 0.0f )
		{
			direction[1] = -direction[1];
		}
		if( sum_rb < 0.0f )
		{
			direction[2] = -direction[2];
		}
	}
	#endif
}